

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_multiclasstask.cc
# Opt level: O0

void MulticlassTask::run(search *sch,multi_ex *ec)

{
  size_t sVar1;
  action aVar2;
  task_data *condition_on;
  undefined8 uVar3;
  uint **ppuVar4;
  ulong uVar5;
  stringstream *psVar6;
  ostream *poVar7;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  ptag unaff_retaddr;
  example *in_stack_00000008;
  search *in_stack_00000010;
  char *in_stack_00000040;
  action *in_stack_00000048;
  size_t prediction;
  float *in_stack_00000058;
  action oracle;
  size_t y_allowed_size;
  size_t mask;
  size_t i;
  size_t learner_id;
  size_t label;
  size_t gold_label;
  task_data *my_task_data;
  undefined8 in_stack_ffffffffffffff58;
  search *in_stack_ffffffffffffff60;
  ulong local_38;
  long local_28;
  
  condition_on = Search::search::get_task_data<MulticlassTask::task_data>(in_RDI);
  std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,0);
  uVar3 = 0;
  local_28 = 0;
  for (local_38 = 0; local_38 < condition_on->num_level; local_38 = local_38 + 1) {
    sVar1 = condition_on->num_level;
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,0);
    ppuVar4 = v_array<unsigned_int>::begin(&condition_on->y_allowed);
    in_stack_ffffffffffffff60 = (search *)*ppuVar4;
    in_stack_ffffffffffffff58 = 0;
    aVar2 = Search::search::predict
                      (in_stack_00000010,in_stack_00000008,unaff_retaddr,(action *)in_RDI,
                       (size_t)in_RSI,(ptag *)condition_on,in_stack_00000040,in_stack_00000048,
                       prediction,in_stack_00000058,y_allowed_size,(float)((ulong)uVar3 >> 0x20));
    if (aVar2 == 2) {
      local_28 = (1L << (((char)sVar1 - (char)local_38) - 1U & 0x3f)) + local_28;
    }
  }
  Search::search::loss(in_stack_ffffffffffffff60,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  Search::search::output_abi_cxx11_(in_RDI);
  uVar5 = std::ios::good();
  if ((uVar5 & 1) != 0) {
    psVar6 = Search::search::output_abi_cxx11_(in_RDI);
    poVar7 = (ostream *)std::ostream::operator<<(psVar6 + 0x10,local_28 + 1);
    std::operator<<(poVar7,' ');
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t gold_label = ec[0]->l.multi.label;
  size_t label = 0;
  size_t learner_id = 0;

  for (size_t i = 0; i < my_task_data->num_level; i++)
  {
    size_t mask = UINT64_ONE << (my_task_data->num_level - i - 1);
    size_t y_allowed_size = (label + mask + 1 <= my_task_data->max_label) ? 2 : 1;
    action oracle = (((gold_label - 1) & mask) > 0) + 1;
    size_t prediction = sch.predict(*ec[0], 0, &oracle, 1, nullptr, nullptr, my_task_data->y_allowed.begin(),
        y_allowed_size, nullptr, learner_id);  // TODO: do we really need y_allowed?
    learner_id = (learner_id << 1) + prediction;
    if (prediction == 2)
      label += mask;
  }
  label += 1;
  sch.loss(!(label == gold_label));
  if (sch.output().good())
    sch.output() << label << ' ';
}